

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode JsVarSerializerWriteValue(JsVarSerializerHandle serializerHandle,JsValueRef rootObject)

{
  JsErrorCode JVar1;
  JsrtContext *currentContext;
  ChakraCoreStreamWriter *streamWriter;
  AutoNestedHandledExceptionType local_48 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  JVar1 = JsErrorNullArgument;
  if (rootObject != (JsValueRef)0x0 && serializerHandle != (JsVarSerializerHandle)0x0) {
    currentContext = JsrtContext::GetCurrent();
    JVar1 = CheckContext(currentContext,false,false);
    if (JVar1 == JsNoError) {
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      ChakraCoreStreamWriter::WriteValue((ChakraCoreStreamWriter *)serializerHandle,rootObject);
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
      JVar1 = JsNoError;
    }
  }
  return JVar1;
}

Assistant:

CHAKRA_API
JsVarSerializerWriteValue(
    _In_ JsVarSerializerHandle serializerHandle,
    _In_ JsValueRef rootObject)
{
    PARAM_NOT_NULL(serializerHandle);
    PARAM_NOT_NULL(rootObject);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        ChakraCoreStreamWriter* streamWriter = reinterpret_cast<ChakraCoreStreamWriter*>(serializerHandle);
        streamWriter->WriteValue(rootObject);
        return JsNoError;
    });
}